

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_loadSourceCodeWithSolvedPath(sysbvm_context_t *context,sysbvm_tuple_t filename)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sourceName;
  sysbvm_tuple_t language;
  undefined1 local_68 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_48_6_0f678a37 gcFrame;
  sysbvm_tuple_t filename_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x30);
  gcFrameRecord.roots = (sysbvm_tuple_t *)filename;
  memset(local_68,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_68);
  sVar1 = sysbvm_io_readWholeFileNamedAsString(context,(sysbvm_tuple_t)gcFrameRecord.roots);
  if (sVar1 == 0) {
    sVar2 = sysbvm_symbol_internWithCString(context,"Failed to load source file from: ");
    sVar2 = sysbvm_string_concat(context,sVar2,(sysbvm_tuple_t)gcFrameRecord.roots);
    sysbvm_errorWithMessageTuple(sVar2);
  }
  sVar2 = sysbvm_filesystem_dirname(context,(sysbvm_tuple_t)gcFrameRecord.roots);
  sourceName = sysbvm_filesystem_basename(context,(sysbvm_tuple_t)gcFrameRecord.roots);
  language = sysbvm_sourceCode_inferLanguageFromSourceName(context,sourceName);
  sVar1 = sysbvm_sourceCode_create(context,sVar1,sVar2,sourceName,language);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_loadSourceCodeWithSolvedPath(sysbvm_context_t *context, sysbvm_tuple_t filename)
{
    struct {
        sysbvm_tuple_t filename;
        sysbvm_tuple_t sourceString;
        sysbvm_tuple_t sourceDirectory;
        sysbvm_tuple_t sourceName;
        sysbvm_tuple_t sourceLanguage;
        sysbvm_tuple_t sourceCode;
    } gcFrame = {
        .filename = filename,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.sourceString = sysbvm_io_readWholeFileNamedAsString(context, gcFrame.filename);
    if(!gcFrame.sourceString)
        sysbvm_errorWithMessageTuple(sysbvm_string_concat(context,
            sysbvm_symbol_internWithCString(context, "Failed to load source file from: "),
            gcFrame.filename));

    gcFrame.sourceDirectory = sysbvm_filesystem_dirname(context, gcFrame.filename);
    gcFrame.sourceName = sysbvm_filesystem_basename(context, gcFrame.filename);
    gcFrame.sourceLanguage = sysbvm_sourceCode_inferLanguageFromSourceName(context, gcFrame.sourceName);
    gcFrame.sourceCode = sysbvm_sourceCode_create(context, gcFrame.sourceString, gcFrame.sourceDirectory, gcFrame.sourceName, gcFrame.sourceLanguage);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.sourceCode;
}